

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::clear(ReferenceContext *this,deUint32 buffers)

{
  int iVar1;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  deUint32 stencil_00;
  int *piVar6;
  ConstPixelBufferAccess *pCVar7;
  TextureFormat *pTVar8;
  bool *pbVar9;
  PixelBufferAccess *this_00;
  PixelBufferAccess *pPVar10;
  byte local_2c6;
  byte local_2c5;
  int local_2ac;
  int local_2a8;
  int s_1;
  int x_1;
  int y_1;
  int stencil;
  int stencilBits;
  undefined1 local_270 [8];
  MultisamplePixelBufferAccess access_2;
  undefined1 local_220 [8];
  MultisamplePixelBufferAccess access_1;
  Vec4 local_1e4;
  int local_1d4;
  int local_1d0;
  int s;
  int x;
  int y;
  bool maskZero;
  bool maskUsed;
  Vec4 c;
  undefined1 local_1a8 [7];
  bool isSRGB;
  MultisamplePixelBufferAccess access;
  undefined1 local_178 [5];
  bool hasStencil;
  bool hasDepth;
  bool hasColor0;
  IVec4 local_150;
  undefined1 local_140 [8];
  IVec4 stencilArea;
  IVec4 local_108;
  undefined1 local_f8 [8];
  IVec4 depthArea;
  IVec4 local_c0;
  undefined1 local_b0 [8];
  IVec4 colorArea;
  IVec4 baseArea;
  MultisamplePixelBufferAccess stencilBuf;
  MultisamplePixelBufferAccess depthBuf;
  MultisamplePixelBufferAccess colorBuf0;
  deUint32 buffers_local;
  ReferenceContext *this_local;
  
  do {
    if ((buffers & 0xffffbaff) != 0) {
      setError(this,0x501);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  getDrawColorbuffer((MultisamplePixelBufferAccess *)
                     &depthBuf.m_access.super_ConstPixelBufferAccess.m_data,this);
  getDrawDepthbuffer((MultisamplePixelBufferAccess *)
                     &stencilBuf.m_access.super_ConstPixelBufferAccess.m_data,this);
  getDrawStencilbuffer((MultisamplePixelBufferAccess *)(baseArea.m_data + 2),this);
  if ((this->m_scissorEnabled & 1U) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(colorArea.m_data + 2),0,0,0x7fffffff,0x7fffffff);
  }
  else {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(colorArea.m_data + 2),&this->m_scissorBox);
  }
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)(depthArea.m_data + 2),
             (MultisamplePixelBufferAccess *)&depthBuf.m_access.super_ConstPixelBufferAccess.m_data)
  ;
  getBufferRect((sglr *)&local_c0,(MultisampleConstPixelBufferAccess *)(depthArea.m_data + 2));
  intersect((sglr *)local_b0,(IVec4 *)(colorArea.m_data + 2),&local_c0);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)(stencilArea.m_data + 2),
             (MultisamplePixelBufferAccess *)
             &stencilBuf.m_access.super_ConstPixelBufferAccess.m_data);
  getBufferRect((sglr *)&local_108,(MultisampleConstPixelBufferAccess *)(stencilArea.m_data + 2));
  intersect((sglr *)local_f8,(IVec4 *)(colorArea.m_data + 2),&local_108);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_178,
             (MultisamplePixelBufferAccess *)(baseArea.m_data + 2));
  getBufferRect((sglr *)&local_150,(MultisampleConstPixelBufferAccess *)local_178);
  intersect((sglr *)local_140,(IVec4 *)(colorArea.m_data + 2),&local_150);
  bVar2 = isEmpty((IVec4 *)local_b0);
  access.m_access.super_ConstPixelBufferAccess.m_data._7_1_ = (bVar2 ^ 0xffU) & 1;
  bVar2 = isEmpty((IVec4 *)local_f8);
  access.m_access.super_ConstPixelBufferAccess.m_data._6_1_ = (bVar2 ^ 0xffU) & 1;
  bVar2 = isEmpty((IVec4 *)local_140);
  access.m_access.super_ConstPixelBufferAccess.m_data._5_1_ = (bVar2 ^ 0xffU) & 1;
  if (((access.m_access.super_ConstPixelBufferAccess.m_data._7_1_ & 1) != 0) &&
     ((buffers & 0x4000) != 0)) {
    piVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_b0);
    iVar5 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_b0);
    iVar4 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_b0);
    iVar1 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_b0);
    rr::getSubregion((MultisamplePixelBufferAccess *)local_1a8,
                     (MultisamplePixelBufferAccess *)
                     &depthBuf.m_access.super_ConstPixelBufferAccess.m_data,iVar5,iVar4,iVar1,
                     *piVar6);
    pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                        ((MultisamplePixelBufferAccess *)
                         &depthBuf.m_access.super_ConstPixelBufferAccess.m_data)->
              super_ConstPixelBufferAccess;
    pTVar8 = tcu::ConstPixelBufferAccess::getFormat(pCVar7);
    c.m_data._8_8_ = *pTVar8;
    bVar2 = tcu::isSRGB((TextureFormat)c.m_data._8_8_);
    if ((bVar2) && ((this->m_sRGBUpdateEnabled & 1U) != 0)) {
      tcu::linearToSRGB((tcu *)&y,&this->m_clearColor);
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y,&this->m_clearColor);
    }
    pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_2c5 = 1;
    if ((*pbVar9 & 1U) != 0) {
      pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_2c5 = 1;
      if ((*pbVar9 & 1U) != 0) {
        pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_2c5 = 1;
        if ((*pbVar9 & 1U) != 0) {
          pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_2c5 = *pbVar9 ^ 0xff;
        }
      }
    }
    x._3_1_ = local_2c5 & 1;
    pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_2c6 = 0;
    if ((*pbVar9 & 1U) == 0) {
      pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_2c6 = 0;
      if ((*pbVar9 & 1U) == 0) {
        pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_2c6 = 0;
        if ((*pbVar9 & 1U) == 0) {
          pbVar9 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_2c6 = *pbVar9 ^ 0xff;
        }
      }
    }
    x._2_1_ = local_2c6 & 1;
    if ((x._3_1_ & 1) == 0) {
      rr::clear((MultisamplePixelBufferAccess *)local_1a8,(Vec4 *)&y);
    }
    else if (x._2_1_ == 0) {
      s = 0;
      while( true ) {
        iVar5 = s;
        pCVar7 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_1a8)->
                  super_ConstPixelBufferAccess;
        iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar7);
        if (iVar4 <= iVar5) break;
        local_1d0 = 0;
        while( true ) {
          iVar5 = local_1d0;
          pCVar7 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_1a8)
                    ->super_ConstPixelBufferAccess;
          iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar7);
          if (iVar4 <= iVar5) break;
          for (local_1d4 = 0; iVar5 = local_1d4,
              iVar4 = rr::MultisamplePixelBufferAccess::getNumSamples
                                ((MultisamplePixelBufferAccess *)local_1a8), iVar5 < iVar4;
              local_1d4 = local_1d4 + 1) {
            this_00 = rr::MultisamplePixelBufferAccess::raw
                                ((MultisamplePixelBufferAccess *)local_1a8);
            pPVar10 = rr::MultisamplePixelBufferAccess::raw
                                ((MultisamplePixelBufferAccess *)local_1a8);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)
                       ((long)&access_1.m_access.super_ConstPixelBufferAccess.m_data + 4),
                       (int)pPVar10,local_1d4,local_1d0);
            tcu::select<float,4>
                      ((tcu *)&local_1e4,(Vector<float,_4> *)&y,
                       (Vector<float,_4> *)
                       ((long)&access_1.m_access.super_ConstPixelBufferAccess.m_data + 4),
                       &this->m_colorMask);
            tcu::PixelBufferAccess::setPixel(this_00,&local_1e4,local_1d4,local_1d0,s);
          }
          local_1d0 = local_1d0 + 1;
        }
        s = s + 1;
      }
    }
  }
  if ((((access.m_access.super_ConstPixelBufferAccess.m_data._6_1_ & 1) != 0) &&
      ((buffers & 0x100) != 0)) && ((this->m_depthMask & 1U) != 0)) {
    piVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_f8);
    iVar5 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_f8);
    iVar4 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_f8);
    iVar1 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_f8);
    rr::getSubregion((MultisamplePixelBufferAccess *)
                     &access_2.m_access.super_ConstPixelBufferAccess.m_data,
                     (MultisamplePixelBufferAccess *)
                     &stencilBuf.m_access.super_ConstPixelBufferAccess.m_data,iVar5,iVar4,iVar1,
                     *piVar6);
    getDepthMultisampleAccess
              ((MultisamplePixelBufferAccess *)local_220,
               (MultisamplePixelBufferAccess *)
               &access_2.m_access.super_ConstPixelBufferAccess.m_data);
    rr::clearDepth((MultisamplePixelBufferAccess *)local_220,this->m_clearDepth);
  }
  if (((access.m_access.super_ConstPixelBufferAccess.m_data._5_1_ & 1) != 0) &&
     ((buffers & 0x400) != 0)) {
    piVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_140);
    iVar5 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_140);
    iVar4 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_140);
    iVar1 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_140);
    rr::getSubregion((MultisamplePixelBufferAccess *)&stencil,
                     (MultisamplePixelBufferAccess *)(baseArea.m_data + 2),iVar5,iVar4,iVar1,*piVar6
                    );
    getStencilMultisampleAccess
              ((MultisamplePixelBufferAccess *)local_270,(MultisamplePixelBufferAccess *)&stencil);
    pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                        ((MultisamplePixelBufferAccess *)(baseArea.m_data + 2))->
              super_ConstPixelBufferAccess;
    pTVar8 = tcu::ConstPixelBufferAccess::getFormat(pCVar7);
    iVar5 = getNumStencilBits(pTVar8);
    stencil_00 = maskStencil(iVar5,this->m_clearStencil);
    if ((this->m_stencil[0].writeMask & (1 << ((byte)iVar5 & 0x1f)) - 1U) ==
        (1 << ((byte)iVar5 & 0x1f)) - 1U) {
      rr::clearStencil((MultisamplePixelBufferAccess *)local_270,stencil_00);
    }
    else {
      s_1 = 0;
      while( true ) {
        pCVar7 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_270)->
                  super_ConstPixelBufferAccess;
        iVar5 = tcu::ConstPixelBufferAccess::getDepth(pCVar7);
        if (iVar5 <= s_1) break;
        local_2a8 = 0;
        while( true ) {
          pCVar7 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_270)
                    ->super_ConstPixelBufferAccess;
          iVar5 = tcu::ConstPixelBufferAccess::getHeight(pCVar7);
          if (iVar5 <= local_2a8) break;
          for (local_2ac = 0;
              iVar5 = rr::MultisamplePixelBufferAccess::getNumSamples
                                ((MultisamplePixelBufferAccess *)local_270), local_2ac < iVar5;
              local_2ac = local_2ac + 1) {
            writeMaskedStencil((MultisamplePixelBufferAccess *)local_270,local_2ac,local_2a8,s_1,
                               stencil_00,this->m_stencil[0].writeMask);
          }
          local_2a8 = local_2a8 + 1;
        }
        s_1 = s_1 + 1;
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clear (deUint32 buffers)
{
	RC_IF_ERROR((buffers & ~(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0, GL_INVALID_VALUE, RC_RET_VOID);

	rr::MultisamplePixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	IVec4								baseArea	= m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);
	IVec4								colorArea	= intersect(baseArea, getBufferRect(colorBuf0));
	IVec4								depthArea	= intersect(baseArea, getBufferRect(depthBuf));
	IVec4								stencilArea	= intersect(baseArea, getBufferRect(stencilBuf));
	bool								hasColor0	= !isEmpty(colorArea);
	bool								hasDepth	= !isEmpty(depthArea);
	bool								hasStencil	= !isEmpty(stencilArea);

	if (hasColor0 && (buffers & GL_COLOR_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf0, colorArea.x(), colorArea.y(), colorArea.z(), colorArea.w());
		bool								isSRGB		= tcu::isSRGB(colorBuf0.raw().getFormat());
		Vec4								c			= (isSRGB && m_sRGBUpdateEnabled) ? tcu::linearToSRGB(m_clearColor) : m_clearColor;
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];

		if (!maskUsed)
			rr::clear(access, c);
		else if (!maskZero)
		{
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						access.raw().setPixel(tcu::select(c, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
		}
		// else all channels masked out
	}

	if (hasDepth && (buffers & GL_DEPTH_BUFFER_BIT) != 0 && m_depthMask)
	{
		rr::MultisamplePixelBufferAccess access = getDepthMultisampleAccess(rr::getSubregion(depthBuf, depthArea.x(), depthArea.y(), depthArea.z(), depthArea.w()));
		rr::clearDepth(access, m_clearDepth);
	}

	if (hasStencil && (buffers & GL_STENCIL_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access					= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, stencilArea.x(), stencilArea.y(), stencilArea.z(), stencilArea.w()));
		int									stencilBits				= getNumStencilBits(stencilBuf.raw().getFormat());
		int									stencil					= maskStencil(stencilBits, m_clearStencil);

		if ((m_stencil[rr::FACETYPE_FRONT].writeMask & ((1u<<stencilBits)-1u)) != ((1u<<stencilBits)-1u))
		{
			// Slow path where depth or stencil is masked out in write.
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
		else
			rr::clearStencil(access, stencil);
	}
}